

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void linux_libkqueue_fork(void)

{
  kqueue *pkVar1;
  kqueue *kq_tmp;
  kqueue *kq;
  kqueue *local_8;
  
  monitoring_tid = 0;
  local_8 = kq_list.lh_first;
  while (local_8 != (kqueue *)0x0) {
    pkVar1 = (local_8->kq_entry).le_next;
    close(local_8->epollfd);
    local_8->epollfd = -1;
    if (0 < local_8->pipefd[0]) {
      close(local_8->pipefd[0]);
    }
    local_8->pipefd[0] = -1;
    if (0 < local_8->pipefd[1]) {
      close(local_8->pipefd[1]);
    }
    local_8->pipefd[1] = -1;
    local_8 = pkVar1;
  }
  return;
}

Assistant:

static void
linux_libkqueue_fork(void)
{
    struct kqueue *kq, *kq_tmp;

    /*
     * We don't have to cancel the monitor thread here
     * as fork() typically only duplicates the thread
     * which called it.
     *
     * Ensure we don't try and cancel it on exit by
     * clearing the thread id.
     *
     * We don't need to lock the kq_mtx here as we're in
     * the child, and none of our threads will have been
     * duplicated.
     */
    monitoring_tid = 0;

    /*
     * If the process has been forked, then we need
     * to destroy all of the kqueue instances in
     * the fork.
     *
     * This replicates the behaviour of real kqueues
     * on FreeBSD, and also prevents spurious leak
     * reports being raised by LSAN.
     */
    LIST_FOREACH_SAFE(kq, &kq_list, kq_entry, kq_tmp) {
        dbg_printf("kq=%p - cleaning up on fork", kq);

        /*
         * There's very limited cleanups we can do
         * here, as we're only allowed to call
         * async-signal-safe functions in this
         * handler.
         *
         * This means any functions which alloc or
         * free memory are ruled out, meaning we
         * can't release any of the memory allocated
         * to the kqueues or filters.
         *
         * Fortunately close() is async-signal-safe.
         */
        close(kq->epollfd);
        kq->epollfd = -1;

        if ((kq->pipefd[0] > 0) && (close(kq->pipefd[0]) < 0))
            dbg_perror("close(2)");
        kq->pipefd[0] = -1;

        if ((kq->pipefd[1] > 0) && (close(kq->pipefd[1]) < 0))
            dbg_perror("close(2)");
        kq->pipefd[1] = -1;
    }
}